

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScene::helpEvent(QGraphicsScene *this,QGraphicsSceneHelpEvent *helpEvent)

{
  QGraphicsScenePrivate *this_00;
  QGraphicsItem *item;
  Data *pDVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QGraphicsItem **ppQVar5;
  char cVar6;
  int iVar7;
  QWidget *pQVar8;
  long lVar9;
  QGraphicsItem *this_01;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QPointF QVar12;
  QPoint point;
  QString local_b8;
  QString local_98;
  QPoint local_80;
  QString local_78;
  QList<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)QGraphicsSceneHelpEvent::screenPos(helpEvent);
  QVar12 = QGraphicsSceneHelpEvent::scenePos(helpEvent);
  local_78.d.d = (Data *)QVar12.xp;
  local_78.d.ptr = (char16_t *)QVar12.yp;
  pQVar8 = QGraphicsSceneEvent::widget(&helpEvent->super_QGraphicsSceneEvent);
  QGraphicsScenePrivate::itemsAtPosition
            (&local_58,this_00,(QPoint *)&local_98,(QPointF *)&local_78,pQVar8);
  ppQVar5 = local_58.d.ptr;
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
    bVar11 = true;
    this_01 = (QGraphicsItem *)0x0;
  }
  else {
    lVar9 = local_58.d.size << 3;
    lVar10 = 0;
    this_01 = (QGraphicsItem *)0x0;
    do {
      item = *(QGraphicsItem **)((long)ppQVar5 + lVar10);
      iVar7 = (*((item->d_ptr).d)->_vptr_QGraphicsItemPrivate[7])();
      if (((char)iVar7 == '\0') ||
         (sendEvent(this,item,(QEvent *)helpEvent),
         (helpEvent->super_QGraphicsSceneEvent).field_0xc == '\0')) {
        QGraphicsItem::toolTip(&local_78,item);
        qVar2 = local_78.d.size;
        bVar11 = local_78.d.size == 0;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (qVar2 != 0) {
          this_01 = item;
        }
        cVar6 = (qVar2 != 0) * '\x02';
      }
      else {
        cVar6 = '\x01';
        bVar11 = false;
      }
      if (!bVar11) goto LAB_0061780e;
      lVar10 = lVar10 + 8;
    } while (lVar9 != lVar10);
    cVar6 = '\x02';
LAB_0061780e:
    bVar11 = cVar6 == '\x02';
  }
  if (bVar11) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (char16_t *)0x0;
    local_78.d.size = 0;
    local_80.xp.m_i = 0;
    local_80.yp.m_i = 0;
    if (this_01 == (QGraphicsItem *)0x0) {
      bVar11 = false;
    }
    else {
      QGraphicsItem::toolTip(&local_98,this_01);
      bVar11 = local_98.d.size != 0;
      if ((QPoint)local_98.d.d != (QPoint)0x0) {
        LOCK();
        *(int *)local_98.d.d = *(int *)local_98.d.d + -1;
        UNLOCK();
        if (*(int *)local_98.d.d == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (bVar11) {
      QGraphicsItem::toolTip(&local_b8,this_01);
      pcVar4 = local_78.d.ptr;
      pDVar3 = local_78.d.d;
      qVar2 = local_b8.d.size;
      pDVar1 = local_b8.d.d;
      local_b8.d.d = local_78.d.d;
      local_78.d.d = pDVar1;
      local_78.d.ptr = local_b8.d.ptr;
      local_b8.d.ptr = pcVar4;
      local_b8.d.size = local_78.d.size;
      local_78.d.size = qVar2;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      local_80 = QGraphicsSceneHelpEvent::screenPos(helpEvent);
    }
    pQVar8 = QGraphicsSceneEvent::widget(&helpEvent->super_QGraphicsSceneEvent);
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0xffffffffffffffff;
    QToolTip::showText(&local_80,&local_78,pQVar8,(QRect *)&local_b8,-1);
    (**(code **)(*(long *)&helpEvent->super_QGraphicsSceneEvent + 0x10))
              (helpEvent,local_78.d.size != 0);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::helpEvent(QGraphicsSceneHelpEvent *helpEvent)
{
#if !QT_CONFIG(tooltip)
    Q_UNUSED(helpEvent);
#else
    // Find the first item that does tooltips
    Q_D(QGraphicsScene);
    const QList<QGraphicsItem *> itemsAtPos = d->itemsAtPosition(helpEvent->screenPos(),
                                                                 helpEvent->scenePos(),
                                                                 helpEvent->widget());
    QGraphicsItem *toolTipItem = nullptr;
    for (auto item : itemsAtPos) {
        if (item->d_func()->isProxyWidget()) {
            // if the item is a proxy widget, the event is forwarded to it
            sendEvent(item, helpEvent);
            if (helpEvent->isAccepted())
                return;
        }
        if (!item->toolTip().isEmpty()) {
            toolTipItem = item;
            break;
        }
    }

    // Show or hide the tooltip
    QString text;
    QPoint point;
    if (toolTipItem && !toolTipItem->toolTip().isEmpty()) {
        text = toolTipItem->toolTip();
        point = helpEvent->screenPos();
    }
    QToolTip::showText(point, text, helpEvent->widget());
    helpEvent->setAccepted(!text.isEmpty());
#endif
}